

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ostream * smf::MidiFile::writeBigEndianULong(ostream *out,ulong value)

{
  undefined1 local_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  anon_union_8_2_8f0da90b data;
  ulong value_local;
  ostream *out_local;
  
  uStack_1d = (char)(value >> 0x18);
  std::operator<<(out,uStack_1d);
  uStack_1e = (char)(value >> 0x10);
  std::operator<<(out,uStack_1e);
  uStack_1f = (char)(value >> 8);
  std::operator<<(out,uStack_1f);
  local_20 = (char)value;
  std::operator<<(out,local_20);
  return out;
}

Assistant:

std::ostream& MidiFile::writeBigEndianULong(std::ostream& out, ulong value) {
	union { char bytes[4]; long ul; } data;
	data.ul = value;
	out << data.bytes[3];
	out << data.bytes[2];
	out << data.bytes[1];
	out << data.bytes[0];
	return out;
}